

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseBitVector.h
# Opt level: O1

BOOLEAN __thiscall
BVSparse<Memory::Recycler>::TestAndSet(BVSparse<Memory::Recycler> *this,BVIndex i)

{
  ulong uVar1;
  BVSparseNode *pBVar2;
  SparseBVUnit *pSVar3;
  uint index;
  Type *local_30;
  Type *prevNextField;
  
  local_30 = (Type *)0x0;
  pBVar2 = NodeFromIndex(this,i,&local_30,true);
  if (pBVar2 == (BVSparseNode *)0x0) {
    pSVar3 = &s_EmptyUnit;
  }
  else {
    pSVar3 = &pBVar2->data;
  }
  index = i & 0x3f;
  BVUnitT<unsigned_long>::AssertRange(index);
  uVar1 = pSVar3->word;
  BVUnitT<unsigned_long>::AssertRange(index);
  pSVar3->word = pSVar3->word | 1L << (sbyte)index;
  return (uVar1 >> ((ulong)i & 0x3f) & 1) != 0;
}

Assistant:

BOOLEAN
BVSparse<TAllocator>::TestAndSet(BVIndex i)
{
    SparseBVUnit * bvUnit = this->BitsFromIndex(i);
    BVIndex bvIndex = SparseBVUnit::Offset(i);
    BOOLEAN bit = bvUnit->Test(bvIndex);
    bvUnit->Set(bvIndex);
    return bit;
}